

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O3

Var Js::CrossSite::CommonThunk
              (RecyclableObject *recyclableObject,JavascriptMethod entryPoint,Arguments *args)

{
  byte *pbVar1;
  ScriptContext *scriptContext;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  HRESULT hr;
  DynamicObject *obj;
  JavascriptFunction *pJVar6;
  undefined4 *puVar7;
  Var pvVar8;
  FrameDisplay *display;
  CheckCodeGenFunction p_Var9;
  ScriptFunction *pSVar10;
  HostScriptContext *pHVar11;
  JavascriptMethod p_Var12;
  uint uVar13;
  uint uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ThreadContext *pTVar17;
  uint uVar18;
  Arguments local_d8;
  Arguments local_c8;
  undefined1 local_b8 [16];
  HostScriptContext **local_a8;
  BOOL *local_a0;
  long local_98;
  IUnknown **local_90;
  undefined1 local_88 [8];
  IUnknown *sourceCaller;
  IUnknown *previousSourceCaller;
  HostScriptContext *local_70;
  HostScriptContext *callerHostScriptContext;
  BOOL wasDispatchExCallerPushed;
  BOOL wasCallerSet;
  HostScriptContext *calleeHostScriptContext;
  ulong local_50;
  FunctionInfo *local_48;
  DynamicObject *local_40;
  undefined8 local_38;
  
  obj = VarTo<Js::DynamicObject,Js::RecyclableObject>(recyclableObject);
  bVar3 = VarIsImpl<Js::JavascriptFunction>(&obj->super_RecyclableObject);
  calleeHostScriptContext = (HostScriptContext *)entryPoint;
  if (bVar3) {
    pJVar6 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(obj);
    local_48 = (pJVar6->functionInfo).ptr;
    if (local_48 == (FunctionInfo *)0x0) goto LAB_00756e8c;
    local_50 = (ulong)(local_48->attributes >> 0x13 & 1);
    local_48->attributes = local_48->attributes & ~CanDefer;
    uVar15 = CONCAT71((int7)((ulong)entryPoint >> 8),1);
  }
  else {
LAB_00756e8c:
    uVar15 = 0;
    local_48 = (FunctionInfo *)0x0;
    local_50 = 0;
  }
  scriptContext =
       (((((obj->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  local_40 = obj;
  iVar4 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(scriptContext);
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d0,"(!targetScriptContext->IsClosed())",
                                "!targetScriptContext->IsClosed()");
    if (!bVar3) goto LAB_0075744a;
    *puVar7 = 0;
  }
  BVar5 = RecyclableObject::IsExternal(&local_40->super_RecyclableObject);
  if (BVar5 == 0) {
    iVar4 = (*(local_40->super_RecyclableObject).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x66])();
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1d1,"(function->IsExternal() || function->IsCrossSiteObject())"
                                  ,"function->IsExternal() || function->IsCrossSiteObject()");
      if (!bVar3) goto LAB_0075744a;
      *puVar7 = 0;
    }
  }
  pTVar17 = scriptContext->threadContext;
  if (pTVar17->isScriptActive == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x1d2,"(targetScriptContext->GetThreadContext()->IsScriptActive())"
                                ,"targetScriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar3) goto LAB_0075744a;
    *puVar7 = 0;
    pTVar17 = scriptContext->threadContext;
  }
  pHVar11 = scriptContext->hostScriptContext;
  _wasDispatchExCallerPushed = pHVar11;
  previousSourceCaller = (IUnknown *)ThreadContext::GetPreviousHostScriptContext(pTVar17);
  local_70 = (HostScriptContext *)previousSourceCaller;
  local_38 = uVar15;
  if ((HostScriptContext *)previousSourceCaller == pHVar11) {
LAB_007571b4:
    pTVar17 = scriptContext->threadContext;
    bVar3 = pTVar17->reentrancySafeOrHandled;
    pTVar17->reentrancySafeOrHandled = true;
    local_c8.Info = args->Info;
    local_c8.Values = args->Values;
    pvVar8 = JavascriptFunction::CallFunction<true>
                       (&local_40->super_RecyclableObject,(JavascriptMethod)calleeHostScriptContext,
                        &local_c8,true);
    pTVar17->reentrancySafeOrHandled = bVar3;
    goto LAB_00757421;
  }
  if ((HostScriptContext *)previousSourceCaller == (HostScriptContext *)0x0) {
    iVar4 = (*pHVar11->_vptr_HostScriptContext[10])(pHVar11);
    if (iVar4 == 0) goto LAB_007571b4;
  }
  (*pHVar11->_vptr_HostScriptContext[0x19])
            (pHVar11,((HostScriptContext *)previousSourceCaller)->scriptContext);
  uVar14 = 0;
  if (*args->Values == (void *)0x0) {
    if (((args->Info).field_0x3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1ea,"(args.IsNewCall())","args.IsNewCall()");
      if (!bVar3) goto LAB_0075744a;
      *puVar7 = 0;
    }
    bVar3 = VarIs<Js::JavascriptProxy,Js::DynamicObject>(local_40);
    uVar14 = 1;
    if (!bVar3) {
      bVar3 = VarIsImpl<Js::JavascriptFunction>(&local_40->super_RecyclableObject);
      if (bVar3) {
        pJVar6 = VarTo<Js::JavascriptFunction,Js::DynamicObject>(local_40);
        if ((((pJVar6->functionInfo).ptr)->attributes & SkipDefaultNewObject) != None)
        goto LAB_00757140;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x1eb,
                                  "(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject))"
                                  ,
                                  "VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject)"
                                 );
      if (!bVar3) goto LAB_0075744a;
      *puVar7 = 0;
    }
  }
LAB_00757140:
  uVar18 = SUB84(args->Info,0);
  uVar13 = uVar18;
  if (uVar14 < (uVar18 & 0xffffff)) {
    uVar16 = (ulong)uVar14;
    do {
      pvVar8 = MarshalVar(scriptContext,args->Values[uVar16],false);
      args->Values[uVar16] = pvVar8;
      uVar16 = uVar16 + 1;
    } while ((uVar18 & 0xffffff) != uVar16);
    uVar13 = SUB84(args->Info,0);
  }
  if ((uVar13 >> 0x1e & 1) == 0) {
    bVar3 = CallInfo::HasExtraArg(uVar13 >> 0x18);
    pHVar11 = calleeHostScriptContext;
    if (bVar3) {
      display = Arguments::GetFrameDisplay(args);
      pvVar8 = MarshalFrameDisplay(scriptContext,display);
      goto LAB_00757221;
    }
  }
  else {
    pvVar8 = CallInfo::GetNewTarget(uVar13 >> 0x18,args->Values,uVar13 & 0xffffff);
    pHVar11 = calleeHostScriptContext;
    pvVar8 = MarshalVar(scriptContext,pvVar8,false);
LAB_00757221:
    args->Values[uVar18 & 0xffffff] = pvVar8;
  }
  p_Var9 = GetCheckCodeGenFunction((JavascriptMethod)pHVar11);
  if (p_Var9 != (CheckCodeGenFunction)0x0) {
    pSVar10 = VarTo<Js::ScriptFunction,Js::DynamicObject>(local_40);
    pHVar11 = (HostScriptContext *)(*p_Var9)(pSVar10);
    p_Var12 = RecyclableObject::GetEntryPoint(&local_40->super_RecyclableObject);
    if (p_Var12 != DefaultThunk && p_Var12 != ProfileThunk) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                  ,0x204,"(CrossSite::IsThunk(function->GetEntryPoint()))",
                                  "CrossSite::IsThunk(function->GetEntryPoint())");
      if (!bVar3) goto LAB_0075744a;
      *puVar7 = 0;
    }
  }
  local_b8._0_8_ = local_88;
  local_88 = (undefined1  [8])0x0;
  local_90 = &sourceCaller;
  sourceCaller = (IUnknown *)0x0;
  local_a8 = &callerHostScriptContext;
  callerHostScriptContext._0_4_ = 0;
  local_98 = (long)&callerHostScriptContext + 4;
  callerHostScriptContext._4_4_ = 0;
  local_b8._8_8_ = &stack0xffffffffffffff90;
  local_a0 = &wasDispatchExCallerPushed;
  hr = (*previousSourceCaller->_vptr_IUnknown[5])();
  if (-1 < hr) {
    hr = (*_wasDispatchExCallerPushed->_vptr_HostScriptContext[4])
                   (_wasDispatchExCallerPushed,local_88,&sourceCaller);
    if (-1 < hr) {
      callerHostScriptContext._4_4_ = 1;
      hr = (*_wasDispatchExCallerPushed->_vptr_HostScriptContext[2])();
      if (-1 < hr) {
        callerHostScriptContext._0_4_ = 1;
        pTVar17 = scriptContext->threadContext;
        bVar3 = pTVar17->reentrancySafeOrHandled;
        pTVar17->reentrancySafeOrHandled = true;
        local_d8.Info = args->Info;
        local_d8.Values = args->Values;
        pvVar8 = JavascriptFunction::CallFunction<true>
                           (&local_40->super_RecyclableObject,(JavascriptMethod)pHVar11,&local_d8,
                            true);
        pTVar17->reentrancySafeOrHandled = bVar3;
        pvVar8 = MarshalVar(local_70->scriptContext,pvVar8,false);
        anon_func::FinallyObject::~FinallyObject((FinallyObject *)local_b8);
        if (pvVar8 == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                      ,0x24a,"(result != nullptr)","result != nullptr");
          if (!bVar3) {
LAB_0075744a:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar7 = 0;
        }
LAB_00757421:
        if (((byte)local_38 & (byte)local_50) == 1) {
          pbVar1 = (byte *)((long)&local_48->attributes + 2);
          *pbVar1 = *pbVar1 | 8;
        }
        return pvVar8;
      }
    }
  }
  JavascriptError::MapAndThrowError(scriptContext,hr);
}

Assistant:

Var CrossSite::CommonThunk(RecyclableObject* recyclableObject, JavascriptMethod entryPoint, Arguments args)
    {
        DynamicObject* function = VarTo<DynamicObject>(recyclableObject);

        FunctionInfo * functionInfo = (VarIs<JavascriptFunction>(function) ? VarTo<JavascriptFunction>(function)->GetFunctionInfo() : nullptr);
        AutoDisableRedeferral autoDisableRedeferral(functionInfo);

        ScriptContext* targetScriptContext = function->GetScriptContext();
        Assert(!targetScriptContext->IsClosed());
        Assert(function->IsExternal() || function->IsCrossSiteObject());
        Assert(targetScriptContext->GetThreadContext()->IsScriptActive());

        HostScriptContext* calleeHostScriptContext = targetScriptContext->GetHostScriptContext();
        HostScriptContext* callerHostScriptContext = targetScriptContext->GetThreadContext()->GetPreviousHostScriptContext();

        if (callerHostScriptContext == calleeHostScriptContext || (callerHostScriptContext == nullptr && !calleeHostScriptContext->HasCaller()))
        {
            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                return JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
        }

#if DBG_DUMP || defined(PROFILE_EXEC) || defined(PROFILE_MEM)
        calleeHostScriptContext->EnsureParentInfo(callerHostScriptContext->GetScriptContext());
#endif

        TTD_XSITE_LOG(recyclableObject->GetScriptContext(), "CommonThunk -- Pass Through", recyclableObject);

        uint i = 0;
        if (args.Values[0] == nullptr)
        {
            i = 1;
            Assert(args.IsNewCall());
            Assert(VarIs<JavascriptProxy>(function) || (VarIs<JavascriptFunction>(function) && VarTo<JavascriptFunction>(function)->GetFunctionInfo()->GetAttributes() & FunctionInfo::SkipDefaultNewObject));
        }
        uint count = args.Info.Count;
        for (; i < count; i++)
        {
            args.Values[i] = CrossSite::MarshalVar(targetScriptContext, args.Values[i]);
        }
        if (args.HasNewTarget())
        {
            // Last value is new.target
            args.Values[count] = CrossSite::MarshalVar(targetScriptContext, args.GetNewTarget());
        }
        else if (args.HasExtraArg())
        {
            // The final eval arg is a frame display that needs to be marshaled specially.
            args.Values[count] = CrossSite::MarshalFrameDisplay(targetScriptContext, args.GetFrameDisplay());
        }


#if ENABLE_NATIVE_CODEGEN
        CheckCodeGenFunction checkCodeGenFunction = GetCheckCodeGenFunction(entryPoint);
        if (checkCodeGenFunction != nullptr)
        {
            ScriptFunction* callFunc = VarTo<ScriptFunction>(function);
            entryPoint = checkCodeGenFunction(callFunc);
            Assert(CrossSite::IsThunk(function->GetEntryPoint()));
        }
#endif

        // We need to setup the caller chain when we go across script site boundary. Property access
        // is OK, and we need to let host know who the caller is when a call is from another script site.
        // CrossSiteObject is the natural place but it is in the target site. We build up the site
        // chain through PushDispatchExCaller/PopDispatchExCaller, and we call SetCaller in the target site
        // to indicate who the caller is. We first need to get the site from the previously pushed site
        // and set that as the caller for current call, and push a new DispatchExCaller for future calls
        // off this site. GetDispatchExCaller and ReleaseDispatchExCaller is used to get the current caller.
        // currentDispatchExCaller is cached to avoid multiple allocations.
        IUnknown* sourceCaller = nullptr, *previousSourceCaller = nullptr;
        HRESULT hr = NOERROR;
        Var result = nullptr;
        BOOL wasDispatchExCallerPushed = FALSE, wasCallerSet = FALSE;

        TryFinally([&]()
        {
            hr = callerHostScriptContext->GetDispatchExCaller((void**)&sourceCaller);

            if (SUCCEEDED(hr))
            {
                hr = calleeHostScriptContext->SetCaller((IUnknown*)sourceCaller, (IUnknown**)&previousSourceCaller);
            }

            if (SUCCEEDED(hr))
            {
                wasCallerSet = TRUE;
                hr = calleeHostScriptContext->PushHostScriptContext();
            }
            if (FAILED(hr))
            {
                // CONSIDER: Should this be callerScriptContext if we failed?
                JavascriptError::MapAndThrowError(targetScriptContext, hr);
            }
            wasDispatchExCallerPushed = TRUE;

            BEGIN_SAFE_REENTRANT_CALL(targetScriptContext->GetThreadContext())
            {
                result = JavascriptFunction::CallFunction<true>(function, entryPoint, args, true /*useLargeArgCount*/);
            }
            END_SAFE_REENTRANT_CALL
            ScriptContext* callerScriptContext = callerHostScriptContext->GetScriptContext();
            result = CrossSite::MarshalVar(callerScriptContext, result);
        },
        [&](bool hasException)
        {
            if (sourceCaller != nullptr)
            {
                callerHostScriptContext->ReleaseDispatchExCaller(sourceCaller);
            }
            IUnknown* originalCaller = nullptr;
            if (wasDispatchExCallerPushed)
            {
                calleeHostScriptContext->PopHostScriptContext();
            }
            if (wasCallerSet)
            {
                calleeHostScriptContext->SetCaller(previousSourceCaller, &originalCaller);
                if (previousSourceCaller)
                {
                    previousSourceCaller->Release();
                }
                if (originalCaller)
                {
                    originalCaller->Release();
                }
            }
        });
        Assert(result != nullptr);
        return result;
    }